

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.c
# Opt level: O0

ENetListIterator enet_list_insert(ENetListIterator position,void *data)

{
  ENetListIterator result;
  void *data_local;
  ENetListIterator position_local;
  
  *(_ENetListNode **)((long)data + 8) = position->previous;
  *(ENetListIterator *)data = position;
  **(undefined8 **)((long)data + 8) = data;
  position->previous = (_ENetListNode *)data;
  return (ENetListIterator)data;
}

Assistant:

ENetListIterator
enet_list_insert (ENetListIterator position, void * data)
{
   ENetListIterator result = (ENetListIterator) data;

   result -> previous = position -> previous;
   result -> next = position;

   result -> previous -> next = result;
   position -> previous = result;

   return result;
}